

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

Boolean __thiscall Js::ConfigFlagsTable::GetDefaultValueAsBoolean(ConfigFlagsTable *this,Flag flag)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  Boolean local_13;
  Boolean retValue;
  Flag flag_local;
  ConfigFlagsTable *this_local;
  
  local_13 = false;
  switch(flag) {
  case ArrayValidateFlag:
    local_13 = false;
    break;
  case MemOpMissingValueValidateFlag:
    local_13 = false;
    break;
  case OOPJITFixupValidateFlag:
    local_13 = false;
    break;
  case ArenaNoFreeListFlag:
    local_13 = false;
    break;
  case ArenaNoPageReuseFlag:
    local_13 = false;
    break;
  case ArenaUseHeapAllocFlag:
    local_13 = false;
    break;
  case ValidateInlineStackFlag:
    local_13 = false;
    break;
  case AsmDiffFlag:
    local_13 = false;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x438,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
    break;
  case AsmJsFlag:
    local_13 = true;
    break;
  case AsmJsStopOnErrorFlag:
    local_13 = false;
    break;
  case AsmJsEdgeFlag:
    local_13 = false;
    break;
  case WasmFlag:
    local_13 = true;
    break;
  case WasmI64Flag:
    local_13 = false;
    break;
  case WasmFastArrayFlag:
    local_13 = false;
    break;
  case WasmSharedArrayVirtualBufferFlag:
    local_13 = true;
    break;
  case WasmMathExFilterFlag:
    local_13 = false;
    break;
  case WasmCheckVersionFlag:
    local_13 = true;
    break;
  case WasmAssignModuleIDFlag:
    local_13 = false;
    break;
  case WasmIgnoreLimitsFlag:
    local_13 = false;
    break;
  case WasmFoldFlag:
    local_13 = true;
    break;
  case WasmIgnoreResponseFlag:
    local_13 = false;
    break;
  case WasmThreadsFlag:
    local_13 = false;
    break;
  case WasmMultiValueFlag:
    local_13 = false;
    break;
  case WasmSignExtendsFlag:
    local_13 = true;
    break;
  case WasmNontrappingFlag:
    local_13 = true;
    break;
  case WasmExperimentalFlag:
    local_13 = false;
    break;
  case WasmSimdFlag:
    local_13 = true;
    break;
  case AssertBreakFlag:
    local_13 = false;
    break;
  case AssertPopUpFlag:
    local_13 = false;
    break;
  case AssertIgnoreFlag:
    local_13 = false;
    break;
  case AsyncDebuggingFlag:
    local_13 = true;
    break;
  case BaselineModeFlag:
    local_13 = false;
    break;
  case BailOutAtEveryLineFlag:
    local_13 = false;
    break;
  case BailOutAtEveryByteCodeFlag:
    local_13 = false;
    break;
  case BailOutAtEveryImplicitCallFlag:
    local_13 = false;
    break;
  case BenchmarkFlag:
    local_13 = false;
    break;
  case BgJitFlag:
    local_13 = true;
    break;
  case BgParseFlag:
    local_13 = false;
    break;
  case CreateFunctionProxyFlag:
    local_13 = true;
    break;
  case HybridFgJitFlag:
    local_13 = false;
    break;
  case BytecodeHistFlag:
    local_13 = false;
    break;
  case CurrentSourceInfoFlag:
    local_13 = true;
    break;
  case CFGLogFlag:
    local_13 = false;
    break;
  case CheckAlignmentFlag:
    local_13 = false;
    break;
  case CheckEmitBufferPermissionsFlag:
    local_13 = false;
    break;
  case CheckMemoryLeakFlag:
    local_13 = false;
    break;
  case CheckOpHelpersFlag:
    local_13 = false;
    break;
  case CloneInlinedPolymorphicCachesFlag:
    local_13 = true;
    break;
  case ConcurrentRuntimeFlag:
    local_13 = false;
    break;
  case CrashOnExceptionFlag:
    local_13 = false;
    break;
  case DebugFlag:
    local_13 = false;
    break;
  case DebugWindowFlag:
    local_13 = false;
    break;
  case ParserStateCacheFlag:
    local_13 = true;
    break;
  case CompressParserStateCacheFlag:
    local_13 = false;
    break;
  case DeferTopLevelTillFirstCallFlag:
    local_13 = true;
    break;
  case DirectCallTelemetryStatsFlag:
    local_13 = false;
    break;
  case DisableArrayBTreeFlag:
    local_13 = false;
    break;
  case DisableRentalThreadingFlag:
    local_13 = false;
    break;
  case DisableVTuneSourceLineInfoFlag:
    local_13 = false;
    break;
  case DisplayMemStatsFlag:
    local_13 = false;
    break;
  case DumpIRAddressesFlag:
    local_13 = false;
    break;
  case DumpLineNoInColorFlag:
    local_13 = false;
    break;
  case DumpObjectGraphOnExitFlag:
    local_13 = false;
    break;
  case DumpObjectGraphOnCollectFlag:
    local_13 = false;
    break;
  case DumpEvalStringOnRemovalFlag:
    local_13 = false;
    break;
  case DumpObjectGraphOnEnumFlag:
    local_13 = false;
    break;
  case WininetProfileCacheFlag:
    local_13 = true;
    break;
  case NoDynamicProfileInMemoryCacheFlag:
    local_13 = false;
    break;
  case ProfileBasedSpeculativeJitFlag:
    local_13 = true;
    break;
  case ExecuteByteCodeBufferReturnsInvalidByteCodeFlag:
    local_13 = false;
    break;
  case SkipSplitOnNoResultFlag:
    local_13 = false;
    break;
  case Force32BitByteCodeFlag:
    local_13 = false;
    break;
  case CollectGarbageFlag:
    local_13 = false;
    break;
  case IntlFlag:
    local_13 = true;
    break;
  case IntlBuiltInsFlag:
    local_13 = true;
    break;
  case IntlPlatformFlag:
    local_13 = false;
    break;
  case JsBuiltInFlag:
    local_13 = true;
    break;
  case JitReproFlag:
    local_13 = false;
    break;
  case EntryPointInfoRpcDataFlag:
    local_13 = false;
    break;
  case LdChakraLibFlag:
    local_13 = false;
    break;
  case TestChakraLibFlag:
    local_13 = false;
    break;
  case ES6Flag:
    local_13 = true;
    break;
  case ES6AllFlag:
    local_13 = false;
    break;
  case ES6ExperimentalFlag:
    local_13 = false;
    break;
  case ES7AsyncAwaitFlag:
    local_13 = true;
    break;
  case ES6DateParseFixFlag:
    local_13 = true;
    break;
  case ES6FunctionNameFullFlag:
    local_13 = true;
    break;
  case ES6GeneratorsFlag:
    local_13 = true;
    break;
  case ES7ExponentiationOperatorFlag:
    local_13 = true;
    break;
  case ES7ValuesEntriesFlag:
    local_13 = true;
    break;
  case ES7TrailingCommaFlag:
    local_13 = true;
    break;
  case ES6IsConcatSpreadableFlag:
    local_13 = true;
    break;
  case ES6MathFlag:
    local_13 = true;
    break;
  case ESDynamicImportFlag:
    local_13 = true;
    break;
  case ES6ModuleFlag:
    local_13 = true;
    break;
  case ES6ObjectFlag:
    local_13 = true;
    break;
  case ES6NumberFlag:
    local_13 = true;
    break;
  case ES6ObjectLiteralsFlag:
    local_13 = true;
    break;
  case ES6ProxyFlag:
    local_13 = true;
    break;
  case ES6RestFlag:
    local_13 = true;
    break;
  case ES6SpreadFlag:
    local_13 = true;
    break;
  case ES6StringFlag:
    local_13 = true;
    break;
  case ES6StringPrototypeFixesFlag:
    local_13 = true;
    break;
  case ES2018ObjectRestSpreadFlag:
    local_13 = true;
    break;
  case ES6PrototypeChainFlag:
    local_13 = true;
    break;
  case ES6ToPrimitiveFlag:
    local_13 = true;
    break;
  case ES6ToLengthFlag:
    local_13 = true;
    break;
  case ES6ToStringTagFlag:
    local_13 = true;
    break;
  case ES6UnicodeFlag:
    local_13 = true;
    break;
  case ES6UnicodeVerboseFlag:
    local_13 = true;
    break;
  case ES6UnscopablesFlag:
    local_13 = true;
    break;
  case ES6RegExStickyFlag:
    local_13 = true;
    break;
  case ES2018RegExDotAllFlag:
    local_13 = true;
    break;
  case ESExportNsAsFlag:
    local_13 = true;
    break;
  case ES2018AsyncIterationFlag:
    local_13 = true;
    break;
  case ESTopLevelAwaitFlag:
    local_13 = true;
    break;
  case ES6RegExPrototypePropertiesFlag:
    local_13 = false;
    break;
  case ES6RegExSymbolsFlag:
    local_13 = false;
    break;
  case ES6VerboseFlag:
    local_13 = false;
    break;
  case ESObjectGetOwnPropertyDescriptorsFlag:
    local_13 = true;
    break;
  case ESSharedArrayBufferFlag:
    local_13 = false;
    break;
  case ESBigIntFlag:
    local_13 = false;
    break;
  case ESNumericSeparatorFlag:
    local_13 = true;
    break;
  case ESNullishCoalescingOperatorFlag:
    local_13 = true;
    break;
  case ESHashbangFlag:
    local_13 = true;
    break;
  case ESSymbolDescriptionFlag:
    local_13 = true;
    break;
  case ESArrayFindFromLastFlag:
    local_13 = true;
    break;
  case ESPromiseAnyFlag:
    local_13 = true;
    break;
  case ESImportMetaFlag:
    local_13 = true;
    break;
  case ESGlobalThisFlag:
    local_13 = true;
    break;
  case JitES6GeneratorsFlag:
    local_13 = false;
    break;
  case FastLineColumnCalculationFlag:
    local_13 = true;
    break;
  case FreeRejittedCodeFlag:
    local_13 = true;
    break;
  case ForceGuardPagesFlag:
    local_13 = false;
    break;
  case PrintGuardPageBoundsFlag:
    local_13 = false;
    break;
  case ForceLegacyEngineFlag:
    local_13 = false;
    break;
  case ForceArrayBTreeFlag:
    local_13 = false;
    break;
  case StrongArraySortFlag:
    local_13 = false;
    break;
  case ForceCleanPropertyOnCollectFlag:
    local_13 = false;
    break;
  case ForceCleanCacheOnCollectFlag:
    local_13 = false;
    break;
  case ForceGCAfterJSONParseFlag:
    local_13 = false;
    break;
  case ForceDecommitOnCollectFlag:
    local_13 = false;
    break;
  case ForceDeferParseFlag:
    local_13 = false;
    break;
  case ForceDiagnosticsModeFlag:
    local_13 = false;
    break;
  case ForceGetWriteWatchOOMFlag:
    local_13 = false;
    break;
  case ForcePostLowerGlobOptInstrStringFlag:
    local_13 = false;
    break;
  case ForceSplitScopeFlag:
    local_13 = false;
    break;
  case EnumerateSpecialPropertiesInDebuggerFlag:
    local_13 = true;
    break;
  case EnableContinueAfterExceptionWrappersForHelpersFlag:
    local_13 = true;
    break;
  case EnableContinueAfterExceptionWrappersForBuiltInsFlag:
    local_13 = true;
    break;
  case EnableFunctionSourceReportForHeapEnumFlag:
    local_13 = true;
    break;
  case ForceDynamicProfileFlag:
    local_13 = false;
    break;
  case ForceES5ArrayFlag:
    local_13 = false;
    break;
  case ForceAsmJsLinkFailFlag:
    local_13 = false;
    break;
  case ForceExpireOnNonCacheCollectFlag:
    local_13 = false;
    break;
  case ForceFastPathFlag:
    local_13 = false;
    break;
  case ForceFloatPrefFlag:
    local_13 = false;
    break;
  case ForceJITLoopBodyFlag:
    local_13 = false;
    break;
  case ForceStaticInterpreterThunkFlag:
    local_13 = false;
    break;
  case DumpCommentsFromReferencedFilesFlag:
    local_13 = false;
    break;
  case EnableFatalErrorOnOOMFlag:
    local_13 = true;
    break;
  case DeferLoadingAvailableSourceFlag:
    local_13 = false;
    break;
  case ForceNativeFlag:
    local_13 = false;
    break;
  case ForceSerializedFlag:
    local_13 = false;
    break;
  case ForceStrictModeFlag:
    local_13 = false;
    break;
  case ForceUndoDeferFlag:
    local_13 = false;
    break;
  case ForceBlockingConcurrentCollectFlag:
    local_13 = false;
    break;
  case FreTestDiagModeFlag:
    local_13 = false;
    break;
  case MediumByteCodeLayoutFlag:
    local_13 = false;
    break;
  case LargeByteCodeLayoutFlag:
    local_13 = false;
    break;
  case GenerateByteCodeBufferReturnsCantGenerateFlag:
    local_13 = false;
    break;
  case HighPrecisionDateFlag:
    local_13 = false;
    break;
  case PrimeRecyclerFlag:
    local_13 = false;
    break;
  case PrivateHeapFlag:
    local_13 = false;
    break;
  case TraceEngineRefcountFlag:
    local_13 = false;
    break;
  case LeakStackTraceFlag:
    local_13 = false;
    break;
  case ForceMemoryLeakFlag:
    local_13 = false;
    break;
  case DumpAfterFinalGCFlag:
    local_13 = false;
    break;
  case ForceOldDateAPIFlag:
    local_13 = false;
    break;
  case ForceMaxJitThreadCountFlag:
    local_13 = false;
    break;
  case MitigateSpectreFlag:
    local_13 = true;
    break;
  case AddMaskingBlocksFlag:
    local_13 = true;
    break;
  case PoisonVarArrayLoadFlag:
    local_13 = true;
    break;
  case PoisonIntArrayLoadFlag:
    local_13 = true;
    break;
  case PoisonFloatArrayLoadFlag:
    local_13 = true;
    break;
  case PoisonTypedArrayLoadFlag:
    local_13 = true;
    break;
  case PoisonStringLoadFlag:
    local_13 = true;
    break;
  case PoisonObjectsForLoadsFlag:
    local_13 = true;
    break;
  case PoisonVarArrayStoreFlag:
    local_13 = true;
    break;
  case PoisonIntArrayStoreFlag:
    local_13 = true;
    break;
  case PoisonFloatArrayStoreFlag:
    local_13 = true;
    break;
  case PoisonTypedArrayStoreFlag:
    local_13 = true;
    break;
  case PoisonStringStoreFlag:
    local_13 = true;
    break;
  case PoisonObjectsForStoresFlag:
    local_13 = true;
    break;
  case EnforceExecutionModeLimitsFlag:
    local_13 = false;
    break;
  case EemlFlag:
    local_13 = false;
    break;
  case NewSimpleJitFlag:
    local_13 = false;
    break;
  case NoDeferParseFlag:
    local_13 = false;
    break;
  case NoLogoFlag:
    local_13 = false;
    break;
  case OOPJITMissingOptsFlag:
    local_13 = false;
    break;
  case CrashOnOOPJITFailureFlag:
    local_13 = false;
    break;
  case OOPCFGRegistrationFlag:
    local_13 = true;
    break;
  case ForceJITCFGCheckFlag:
    local_13 = false;
    break;
  case UseJITTrampolineFlag:
    local_13 = true;
    break;
  case NoNativeFlag:
    local_13 = false;
    break;
  case NoStrictModeFlag:
    local_13 = false;
    break;
  case NormalizeStatsFlag:
    local_13 = false;
    break;
  case InMemoryTraceFlag:
    local_13 = false;
    break;
  case TraceWithStackFlag:
    local_13 = false;
    break;
  case PrintRunTimeDataCollectionTraceFlag:
    local_13 = false;
    break;
  case PrejitFlag:
    local_13 = false;
    break;
  case PrintSrcInDumpFlag:
    local_13 = true;
    break;
  case ProfileObjectLiteralFlag:
    local_13 = false;
    break;
  case ProfileStringsFlag:
    local_13 = false;
    break;
  case ProfileTypesFlag:
    local_13 = false;
    break;
  case ProfileEvalMapFlag:
    local_13 = false;
    break;
  case ProfileBailOutRecordMemoryFlag:
    local_13 = false;
    break;
  case ValidateIntRangesFlag:
    local_13 = false;
    break;
  case LibraryStackFrameFlag:
    local_13 = true;
    break;
  case LibraryStackFrameDebuggerFlag:
    local_13 = false;
    break;
  case RecyclerStressFlag:
    local_13 = false;
    break;
  case RecyclerBackgroundStressFlag:
    local_13 = false;
    break;
  case RecyclerConcurrentStressFlag:
    local_13 = false;
    break;
  case RecyclerConcurrentRepeatStressFlag:
    local_13 = false;
    break;
  case RecyclerPartialStressFlag:
    local_13 = false;
    break;
  case RecyclerTrackStressFlag:
    local_13 = false;
    break;
  case RecyclerInduceFalsePositivesFlag:
    local_13 = false;
    break;
  case RecyclerForceMarkInteriorFlag:
    local_13 = false;
    break;
  case EnableConcurrentSweepAllocFlag:
    local_13 = true;
    break;
  case ecsaFlag:
    local_13 = true;
    break;
  case PageHeapAllocStackFlag:
    local_13 = false;
    break;
  case PageHeapFreeStackFlag:
    local_13 = false;
    break;
  case PageHeapDecommitGuardPageFlag:
    local_13 = true;
    break;
  case RecyclerNoPageReuseFlag:
    local_13 = false;
    break;
  case RecyclerTestFlag:
    local_13 = false;
    break;
  case RecyclerProtectPagesOnRescanFlag:
    local_13 = false;
    break;
  case RecyclerVerifyMarkFlag:
    local_13 = false;
    break;
  case SwallowExceptionsFlag:
    local_13 = false;
    break;
  case PrintSystemExceptionFlag:
    local_13 = false;
    break;
  case TraceWin8AllocationsFlag:
    local_13 = false;
    break;
  case TraceWin8DeallocationsImmediateFlag:
    local_13 = false;
    break;
  case PrintWin8StatsDetailedFlag:
    local_13 = false;
    break;
  case TraceProtectPagesFlag:
    local_13 = false;
    break;
  case TraceAsyncDebugCallsFlag:
    local_13 = false;
    break;
  case TrackDispatchFlag:
    local_13 = false;
    break;
  case VerboseFlag:
    local_13 = false;
    break;
  case UseFullNameFlag:
    local_13 = true;
    break;
  case Utf8Flag:
    local_13 = false;
    break;
  case WERExceptionSupportFlag:
    local_13 = false;
    break;
  case ExtendedErrorStackForTestHostFlag:
    local_13 = false;
    break;
  case errorStackTraceFlag:
    local_13 = true;
    break;
  case DoHeapEnumOnEngineShutdownFlag:
    local_13 = false;
    break;
  case RegexTracingFlag:
    local_13 = false;
    break;
  case RegexProfileFlag:
    local_13 = false;
    break;
  case RegexDebugFlag:
    local_13 = false;
    break;
  case RegexDebugASTFlag:
    local_13 = true;
    break;
  case RegexDebugAnnotatedASTFlag:
    local_13 = true;
    break;
  case RegexBytecodeDebugFlag:
    local_13 = false;
    break;
  case RegexOptimizeFlag:
    local_13 = true;
    break;
  case OptimizeForManyInstancesFlag:
    local_13 = false;
    break;
  case EnableArrayTypeMutationFlag:
    local_13 = false;
    break;
  case EnableEvalMapCleanupFlag:
    local_13 = true;
    break;
  case TraceObjectAllocationFlag:
    local_13 = false;
    break;
  case ForceStringKeyedSimpleDictionaryTypeHandlerFlag:
    local_13 = false;
    break;
  case TypeSnapshotEnumerationFlag:
    local_13 = true;
    break;
  case IsolatePrototypesFlag:
    local_13 = true;
    break;
  case ChangeTypeOnProtoFlag:
    local_13 = true;
    break;
  case ShareInlineCachesFlag:
    local_13 = false;
    break;
  case DisableDebugObjectFlag:
    local_13 = false;
    break;
  case DumpHeapFlag:
    local_13 = false;
    break;
  case MemProtectHeapStressFlag:
    local_13 = false;
    break;
  case MemProtectHeapBackgroundStressFlag:
    local_13 = false;
    break;
  case MemProtectHeapConcurrentStressFlag:
    local_13 = false;
    break;
  case MemProtectHeapConcurrentRepeatStressFlag:
    local_13 = false;
    break;
  case MemProtectHeapPartialStressFlag:
    local_13 = false;
    break;
  case FixPropsOnPathTypesFlag:
    local_13 = true;
    break;
  case ZeroMemoryWithNonTemporalStoreFlag:
    local_13 = true;
    break;
  case InitializeInterpreterSlotsWithInvalidStackVarFlag:
    local_13 = false;
    break;
  case ClearInlineCachesOnCollectFlag:
    local_13 = false;
    break;
  case StrictWriteBarrierCheckFlag:
    local_13 = false;
    break;
  case WriteBarrierTestFlag:
    local_13 = false;
    break;
  case ForceSoftwareWriteBarrierFlag:
    local_13 = true;
    break;
  case VerifyBarrierBitFlag:
    local_13 = false;
    break;
  case EnableBGFreeZeroFlag:
    local_13 = true;
    break;
  case KeepRecyclerTrackDataFlag:
    local_13 = false;
  }
  return local_13;
}

Assistant:

Boolean
    ConfigFlagsTable::GetDefaultValueAsBoolean(Flag flag) const
    {
        Boolean retValue = FALSE;

        switch (flag)
        {
#define FLAG(type, name, description, defaultValue, ...) FLAGDEFAULT##type(name, defaultValue)
            // define an overload for each FlagTypes - type
            //   * all defaults we don't care about
#define FLAGDEFAULTPhases(name, defaultValue)
#define FLAGDEFAULTString(name, defaultValue)
#define FLAGDEFAULTNumber(name, defaultValue)
#define FLAGDEFAULTNumberSet(name, defaultValue)
#define FLAGDEFAULTNumberRange(name, defaultValue)
#define FLAGDEFAULTNumberPairSet(name, defaultValue)
#define FLAGDEFAULTNumberTrioSet(name, defaultValue)
            //   * and those we do care about
#define FLAGDEFAULTBoolean(name, defaultValue) \
        case name##Flag: \
            retValue = (Boolean) defaultValue; \
            break; \

#include "ConfigFlagsList.h"

#undef FLAGDEFAULTBoolean
#undef FLAGDEFAULTNumberRange
#undef FLAGDEFAULTNumberPairSet
#undef FLAGDEFAULTNumberTrioSet
#undef FLAGDEFAULTNumberSet
#undef FLAGDEFAULTNumber
#undef FLAGDEFAULTString
#undef FLAGDEFAULTPhases
#undef FLAG

#undef FLAGREGOVREXPBoolean
#undef FLAGREGOVREXPNumberRange
#undef FLAGREGOVREXPNumberPairSet
#undef FLAGREGOVREXPNumberTrioSet
#undef FLAGREGOVREXPNumberSet
#undef FLAGREGOVREXPNumber
#undef FLAGREGOVREXPString
#undef FLAGREGOVREXPPhases

#undef FLAGREGOVRBoolean
#undef FLAGREGOVRNumberRange
#undef FLAGREGOVRNumberPairSet
#undef FLAGREGOVRNumberTrioSet
#undef FLAGREGOVRNumberSet
#undef FLAGREGOVRNumber
#undef FLAGREGOVRString
#undef FLAGREGOVRPhases

        default:
            // not found - or not a boolean flag
            Assert(false);
        }

        return retValue;
    }